

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

ZipFile * __thiscall Assimp::ZipFileInfo::Extract(ZipFileInfo *this,unzFile zip_handle)

{
  int iVar1;
  ZipFile *this_00;
  
  iVar1 = unzGoToFilePos(zip_handle,&this->m_ZipFilePos);
  if ((iVar1 != 0) || (iVar1 = unzOpenCurrentFile(zip_handle), iVar1 != 0)) {
    return (ZipFile *)0x0;
  }
  this_00 = (ZipFile *)Intern::AllocateFromAssimpHeap::operator_new(0x20);
  ZipFile::ZipFile(this_00,this->m_Size);
  iVar1 = unzReadCurrentFile(zip_handle,
                             (this_00->m_Buffer)._M_t.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                             (int)this->m_Size);
  if (iVar1 != (int)this->m_Size) {
    (*(this_00->super_IOStream)._vptr_IOStream[1])(this_00);
    this_00 = (ZipFile *)0x0;
  }
  iVar1 = unzCloseCurrentFile(zip_handle);
  if (iVar1 == 0) {
    return this_00;
  }
  __assert_fail("unzCloseCurrentFile(zip_handle) == (0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0xef,"ZipFile *Assimp::ZipFileInfo::Extract(unzFile) const");
}

Assistant:

ZipFile * ZipFileInfo::Extract(unzFile zip_handle) const {
        // Find in the ZIP. This cannot fail
        unz_file_pos_s *filepos = const_cast<unz_file_pos_s*>(&(m_ZipFilePos));
        if (unzGoToFilePos(zip_handle, filepos) != UNZ_OK)
            return nullptr;

        if (unzOpenCurrentFile(zip_handle) != UNZ_OK)
            return nullptr;

        ZipFile *zip_file = new ZipFile(m_Size);

        if (unzReadCurrentFile(zip_handle, zip_file->m_Buffer.get(), static_cast<unsigned int>(m_Size)) != static_cast<int>(m_Size))
        {
            // Failed, release the memory
            delete zip_file;
            zip_file = nullptr;
        }

        ai_assert(unzCloseCurrentFile(zip_handle) == UNZ_OK);
        return zip_file;
    }